

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

bool __thiscall ftxui::ComponentBase::Active(ComponentBase *this)

{
  bool bVar1;
  ComponentBase *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if (this->parent_ == (ComponentBase *)0x0) {
    bVar1 = true;
  }
  else {
    (*this->parent_->_vptr_ComponentBase[4])(&local_20);
    bVar1 = local_20 == this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  }
  return bVar1;
}

Assistant:

bool ComponentBase::Active() const {
  return !parent_ || parent_->ActiveChild().get() == this;
}